

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O2

Oop __thiscall Lodtalk::Behavior::superLookupSelector(Behavior *this,Oop selector)

{
  Oop OVar1;
  
  if (this->superclass == (Behavior *)&NilObject) {
    return (Oop)&NilObject;
  }
  OVar1 = lookupSelector(this->superclass,selector);
  return (Oop)OVar1.field_0;
}

Assistant:

Oop Behavior::superLookupSelector(Oop selector)
{
	// Find in the super class.
	if(isNil(superclass))
		return nilOop();
	return superclass->lookupSelector(selector);
}